

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

MatrixXd * __thiscall
lf::uscalfe::FeLagrangeO3Tria<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeLagrangeO3Tria<double> *this)

{
  DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *this_00;
  DenseBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *this_01;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<double,_2,_10,_0,_2,_10>_> *this_02;
  CommaInitializer<Eigen::Matrix<double,_2,_10,_0,_2,_10>_> local_290;
  Scalar local_270;
  Scalar local_268;
  Scalar local_260;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_258;
  Scalar local_238;
  Scalar local_230;
  Scalar local_228;
  Scalar local_220;
  Scalar local_218;
  Scalar local_210;
  Scalar local_208;
  Scalar local_200;
  Scalar local_1f8;
  Scalar local_1f0;
  Scalar local_1e8;
  Scalar local_1e0;
  CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> local_1d8;
  Scalar local_1b8;
  Scalar local_1b0;
  Scalar local_1a8;
  Scalar local_1a0 [3];
  Scalar local_188;
  Scalar local_180;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> local_178;
  undefined1 local_158 [8];
  Matrix<double,_2,_1,_0,_2,_1> center;
  Matrix<double,_2,_6,_0,_2,_6> edges;
  Matrix<double,_2,_3,_0,_2,_3> vertices;
  Matrix<double,_2,_10,_0,_2,_10> nodes;
  FeLagrangeO3Tria<double> *this_local;
  
  Eigen::Matrix<double,_2,_10,_0,_2,_10>::Matrix
            ((Matrix<double,_2,_10,_0,_2,_10> *)
             (vertices.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data
              .array + 5));
  this_00 = (DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)
            (edges.super_PlainObjectBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>.m_storage.m_data.
             array + 0xb);
  Eigen::Matrix<double,_2,_3,_0,_2,_3>::Matrix((Matrix<double,_2,_3,_0,_2,_3> *)this_00);
  Eigen::Matrix<double,_2,_6,_0,_2,_6>::Matrix
            ((Matrix<double,_2,_6,_0,_2,_6> *)
             (center.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_158);
  local_180 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator<<(&local_178,this_00,&local_180)
  ;
  local_188 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator_
                     (&local_178,&local_188);
  local_1a0[0] = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator_
                     (pCVar1,local_1a0);
  local_1a8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator_
                     (pCVar1,&local_1a8);
  local_1b0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator_
                     (pCVar1,&local_1b0);
  local_1b8 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::operator_(pCVar1,&local_1b8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::~CommaInitializer(&local_178);
  local_1e0 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator<<
            (&local_1d8,
             (DenseBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *)
             (center.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1),&local_1e0);
  local_1e8 = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (&local_1d8,&local_1e8);
  local_1f0 = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar2,&local_1f0);
  local_1f8 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar2,&local_1f8);
  local_200 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar2,&local_200);
  local_208 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar2,&local_208);
  local_210 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar2,&local_210);
  local_218 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar2,&local_218);
  local_220 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar2,&local_220);
  local_228 = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar2,&local_228);
  local_230 = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_
                     (pCVar2,&local_230);
  local_238 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator_(pCVar2,&local_238);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::~CommaInitializer(&local_1d8);
  local_260 = 0.3333333333333333;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
            (&local_258,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_158,&local_260);
  local_268 = 0.3333333333333333;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_258,&local_268);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_258);
  local_270 = 0.3333333333333333;
  this_01 = (DenseBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_> *)
            (center.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
             array + 1);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>::operator*=(this_01,&local_270);
  Eigen::DenseBase<Eigen::Matrix<double,2,10,0,2,10>>::operator<<
            (&local_290,
             (DenseBase<Eigen::Matrix<double,2,10,0,2,10>> *)
             (vertices.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data
              .array + 5),
             (DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)
             (edges.super_PlainObjectBase<Eigen::Matrix<double,_2,_6,_0,_2,_6>_>.m_storage.m_data.
              array + 0xb));
  this_02 = Eigen::CommaInitializer<Eigen::Matrix<double,2,10,0,2,10>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,2,10,0,2,10>> *)&local_290,this_01);
  Eigen::CommaInitializer<Eigen::Matrix<double,2,10,0,2,10>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,10,0,2,10>> *)this_02,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_158);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_10,_0,_2,_10>_>::~CommaInitializer(&local_290);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,10,0,2,10>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::Matrix<double,_2,_10,_0,_2,_10>_> *)
             (vertices.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data
              .array + 5));
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    Eigen::Matrix<double, 2, 10> nodes;
    Eigen::Matrix<double, 2, 3> vertices;
    Eigen::Matrix<double, 2, 6> edges;
    Eigen::Matrix<double, 2, 1> center;

    // clang-format off
    vertices << 0.0, 1.0, 0.0,
                0.0, 0.0, 1.0;
    edges << 1.0, 2.0, 2.0, 1.0, 0.0, 0.0,
             0.0, 0.0, 1.0, 2.0, 2.0, 1.0;
    center << 1.0 / 3.0,
              1.0 / 3.0;
    // clang-format on
    edges *= 1.0 / 3.0;
    nodes << vertices, edges, center;

    return nodes;
  }